

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void datetimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  ushort uVar5;
  short sVar6;
  uint uVar7;
  int iVar8;
  char cVar9;
  short sVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  char *z;
  undefined1 uVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  undefined1 local_68 [12];
  int iStack_5c;
  undefined8 local_58;
  undefined1 *puStack_50;
  double local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined1 *puStack_20;
  long local_18;
  byte bVar2;
  char cVar3;
  char cVar4;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffa0 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = -NAN;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  iVar12 = isDate(context,argc,argv,(DateTime *)local_68);
  if (iVar12 == 0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    computeYMD((DateTime *)local_68);
    computeHMS((DateTime *)local_68);
    uVar7 = -local_68._8_4_;
    if (0 < (int)local_68._8_4_) {
      uVar7 = local_68._8_4_;
    }
    auVar17._0_4_ = (uVar7 / 1000) % 10;
    auVar17._4_4_ = (uVar7 / 100) % 10;
    auVar17._8_4_ = (uVar7 / 10) % 10;
    auVar17._12_4_ = uVar7 % 10;
    auVar17 = auVar17 & _DAT_00209010;
    uVar5 = auVar17._0_2_;
    bVar1 = (uVar5 != 0) * (uVar5 < 0x100) * auVar17[0] - (0xff < uVar5);
    uVar5 = auVar17._4_2_;
    bVar2 = (uVar5 != 0) * (uVar5 < 0x100) * auVar17[4] - (0xff < uVar5);
    sVar6 = auVar17._8_2_;
    cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar17[8] - (0xff < sVar6);
    sVar6 = auVar17._10_2_;
    sVar10 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar17[10] - (0xff < sVar6),cVar3);
    sVar6 = auVar17._12_2_;
    cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar17[0xc] - (0xff < sVar6);
    sVar6 = auVar17._14_2_;
    sVar6 = (short)(CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar17[0xe] - (0xff < sVar6),
                             CONCAT12(cVar4,sVar10)) >> 0x10);
    cVar9 = (char)(iStack_5c / 10);
    local_38 = (undefined1 *)
               CONCAT17((char)((ulong)stack0xffffffffffffffa0 >> 0x20) + cVar9 * -10 + '0',
                        CONCAT16(cVar9 + (char)((iStack_5c / 10) / 10) * -10 + '0',
                                 CONCAT15(0x2d,CONCAT41(CONCAT13((0 < sVar6) * (sVar6 < 0x100) *
                                                                 cVar4 - (0xff < sVar6),
                                                                 CONCAT12((0 < sVar10) *
                                                                          (sVar10 < 0x100) * cVar3 -
                                                                          (0xff < sVar10),
                                                                          CONCAT11((bVar2 != 0) *
                                                                                   (bVar2 < 0x100) *
                                                                                   bVar2 - (0xff < 
                                                  bVar2),(bVar1 != 0) * (bVar1 < 0x100) * bVar1 -
                                                         (0xff < bVar1)))) | (uint)DAT_00209020,
                                                  (char)local_38))));
    cVar3 = (char)((int)local_58 / 10);
    cVar4 = (char)(local_58._4_4_ / 10);
    cVar9 = (char)((int)puStack_50 / 10);
    uStack_30 = (undefined1 *)
                CONCAT17(cVar9 + (char)(((int)puStack_50 / 10) / 10) * -10 + '0',
                         CONCAT16(0x3a,CONCAT15((char)((ulong)local_58 >> 0x20) + cVar4 * -10 + '0',
                                                CONCAT14(cVar4 + (char)((local_58._4_4_ / 10) / 10)
                                                                 * -10 + '0',
                                                         CONCAT13(0x20,CONCAT12((char)local_58 +
                                                                                cVar3 * -10 + '0',
                                                                                CONCAT11(cVar3 + (
                                                  char)(((int)local_58 / 10) / 10) * -10 + '0',0x2d)
                                                  ))))));
    local_28._0_2_ = CONCAT11(0x3a,(char)puStack_50 + cVar9 * -10 + '0');
    if (((ulong)local_40 & 0x400000000) == 0) {
      iVar15 = (int)local_48;
      iVar12 = iVar15 / 10;
      iVar14 = 0x14;
      uVar16 = 0;
    }
    else {
      iVar13 = (int)(local_48 * 1000.0 + 0.5);
      iVar12 = iVar13 / 10000;
      iVar15 = iVar13 / 1000;
      iVar14 = iVar13 / 100;
      iVar8 = iVar13 / 10;
      local_28 = (undefined1 *)
                 CONCAT17((char)iVar13 + (char)iVar8 * -10 + '0',
                          CONCAT16((char)iVar8 +
                                   ((char)(uint)((ulong)((long)iVar8 * 0x66666667) >> 0x22) -
                                   (char)(iVar8 >> 0x1f)) * -10 + '0',
                                   CONCAT15((char)iVar14 +
                                            ((char)(uint)((ulong)((long)iVar14 * 0x66666667) >> 0x22
                                                         ) - (char)(iVar14 >> 0x1f)) * -10 + '0',
                                            (undefined5)local_28)));
      puStack_20 = (undefined1 *)((ulong)puStack_20 & 0xffffffffffffff00);
      iVar14 = 0x18;
      uVar16 = 0x2e;
    }
    uVar11 = local_28;
    local_28._5_3_ = SUB83(uVar11,5);
    local_28._0_5_ =
         CONCAT14(uVar16,CONCAT13((char)iVar15 + (char)(iVar15 / 10) * -10 + '0',
                                  CONCAT12((char)iVar12 + (char)(iVar12 / 10) * -10 + '0',
                                           (undefined2)local_28)));
    if ((int)local_68._8_4_ < 0) {
      z = (char *)&local_38;
      local_38 = (undefined1 *)CONCAT71(local_38._1_7_,0x2d);
    }
    else {
      z = (char *)((long)&local_38 + 1);
      iVar14 = iVar14 + -1;
    }
    setResultStrOrError(context,z,iVar14,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void datetimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y, s, n;
    char zBuf[32];
    computeYMD_HMS(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = ' ';
    zBuf[12] = '0' + (x.h/10)%10;
    zBuf[13] = '0' + (x.h)%10;
    zBuf[14] = ':';
    zBuf[15] = '0' + (x.m/10)%10;
    zBuf[16] = '0' + (x.m)%10;
    zBuf[17] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[18] = '0' + (s/10000)%10;
      zBuf[19] = '0' + (s/1000)%10;
      zBuf[20] = '.';
      zBuf[21] = '0' + (s/100)%10;
      zBuf[22] = '0' + (s/10)%10;
      zBuf[23] = '0' + (s)%10;
      zBuf[24] = 0;
      n = 24;
    }else{
      s = (int)x.s;
      zBuf[18] = '0' + (s/10)%10;
      zBuf[19] = '0' + (s)%10;
      zBuf[20] = 0;
      n = 20;
    }
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], n-1, SQLITE_TRANSIENT);
    }
  }
}